

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

uint32_t u8_nextchar(char *s,int *i)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int sz;
  uint32_t ch;
  int *i_local;
  char *s_local;
  
  local_1c = 0;
  local_20 = 0;
  iVar1 = local_20;
  do {
    local_20 = iVar1;
    iVar1 = *i;
    *i = iVar1 + 1;
    local_1c = (uint)(byte)s[iVar1] + local_1c * 0x40;
    bVar2 = false;
    if (s[*i] != '\0') {
      bVar2 = ((int)s[*i] & 0xc0U) == 0x80;
    }
    iVar1 = local_20 + 1;
  } while (bVar2);
  return local_1c - offsetsFromUTF8[local_20];
}

Assistant:

uint32_t u8_nextchar(const char *s, int *i)
{
    uint32_t ch = 0;
    int sz = 0;

    do {
        ch <<= 6;
        ch += (unsigned char)s[(*i)++];
        sz++;
    } while (s[*i] && !isutf(s[*i]));
    ch -= offsetsFromUTF8[sz-1];

    return ch;
}